

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_targetCBlockSize_body
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,size_t bss,
                 U32 lastBlock)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  void *in_RCX;
  size_t in_RDX;
  BYTE *in_RSI;
  long in_RDI;
  size_t in_R8;
  void *in_R9;
  size_t err_code;
  size_t maxCSize;
  size_t cSize;
  uint in_stack_0000011c;
  size_t in_stack_00000120;
  void *in_stack_00000128;
  size_t in_stack_00000130;
  void *in_stack_00000138;
  ZSTD_CCtx *in_stack_00000140;
  undefined8 in_stack_ffffffffffffffa8;
  U32 lastBlock_00;
  size_t in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  
  lastBlock_00 = (U32)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (in_R9 == (void *)0x0) {
    if (((*(int *)(in_RDI + 0x398) == 0) &&
        (iVar1 = ZSTD_maybeRLE((seqStore_t *)(in_RDI + 0x3a0)), iVar1 != 0)) &&
       (iVar1 = ZSTD_isRLE(in_RSI,in_RDX), iVar1 != 0)) {
      sVar3 = ZSTD_rleCompressBlock
                        (in_RCX,in_R8,(BYTE)((ulong)in_R9 >> 0x38),in_stack_ffffffffffffffc0,
                         (U32)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      return sVar3;
    }
    in_stack_ffffffffffffffc0 =
         ZSTD_compressSuperBlock
                   (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
                    in_stack_00000120,in_stack_0000011c);
    if (in_stack_ffffffffffffffc0 != 0xffffffffffffffba) {
      sVar3 = ZSTD_minGain(in_stack_ffffffffffffffb0,(ZSTD_strategy)(in_R8 >> 0x20));
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffc0;
      in_stack_ffffffffffffffb8 = (void *)(in_R8 - sVar3);
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffb0;
      uVar2 = ERR_isError(in_stack_ffffffffffffffb0);
      lastBlock_00 = (U32)(in_R8 >> 0x20);
      if (uVar2 != 0) {
        return in_stack_ffffffffffffffb0;
      }
      if ((in_stack_ffffffffffffffc0 != 0) &&
         (in_stack_ffffffffffffffc0 < (long)in_stack_ffffffffffffffb8 + 3U)) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables((ZSTD_blockState_t *)(in_RDI + 0xc68));
        return in_stack_ffffffffffffffc0;
      }
    }
  }
  sVar3 = ZSTD_noCompressBlock
                    (in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0,lastBlock_00);
  return sVar3;
}

Assistant:

static size_t ZSTD_compressBlock_targetCBlockSize_body(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                               const size_t bss, U32 lastBlock)
{
    DEBUGLOG(6, "Attempting ZSTD_compressSuperBlock()");
    if (bss == ZSTDbss_compress) {
        if (/* We don't want to emit our first block as a RLE even if it qualifies because
            * doing so will cause the decoder (cli only) to throw a "should consume all input error."
            * This is only an issue for zstd <= v1.4.3
            */
            !zc->isFirstBlock &&
            ZSTD_maybeRLE(&zc->seqStore) &&
            ZSTD_isRLE((BYTE const*)src, srcSize))
        {
            return ZSTD_rleCompressBlock(dst, dstCapacity, *(BYTE const*)src, srcSize, lastBlock);
        }
        /* Attempt superblock compression.
         *
         * Note that compressed size of ZSTD_compressSuperBlock() is not bound by the
         * standard ZSTD_compressBound(). This is a problem, because even if we have
         * space now, taking an extra byte now could cause us to run out of space later
         * and violate ZSTD_compressBound().
         *
         * Define blockBound(blockSize) = blockSize + ZSTD_blockHeaderSize.
         *
         * In order to respect ZSTD_compressBound() we must attempt to emit a raw
         * uncompressed block in these cases:
         *   * cSize == 0: Return code for an uncompressed block.
         *   * cSize == dstSize_tooSmall: We may have expanded beyond blockBound(srcSize).
         *     ZSTD_noCompressBlock() will return dstSize_tooSmall if we are really out of
         *     output space.
         *   * cSize >= blockBound(srcSize): We have expanded the block too much so
         *     emit an uncompressed block.
         */
        {   size_t const cSize =
                ZSTD_compressSuperBlock(zc, dst, dstCapacity, src, srcSize, lastBlock);
            if (cSize != ERROR(dstSize_tooSmall)) {
                size_t const maxCSize =
                    srcSize - ZSTD_minGain(srcSize, zc->appliedParams.cParams.strategy);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressSuperBlock failed");
                if (cSize != 0 && cSize < maxCSize + ZSTD_blockHeaderSize) {
                    ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
                    return cSize;
                }
            }
        }
    } /* if (bss == ZSTDbss_compress)*/

    DEBUGLOG(6, "Resorting to ZSTD_noCompressBlock()");
    /* Superblock compression failed, attempt to emit a single no compress block.
     * The decoder will be able to stream this block since it is uncompressed.
     */
    return ZSTD_noCompressBlock(dst, dstCapacity, src, srcSize, lastBlock);
}